

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
* __thiscall
LongReadsMapper::filter_mappings_by_size_and_id
          (vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           *__return_storage_ptr__,LongReadsMapper *this,int64_t size,float id)

{
  pointer pLVar1;
  long lVar2;
  LongReadMapping *m;
  pointer __args;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::resize(__return_storage_ptr__,
           (long)(this->datastore->read_to_fileRecord).
                 super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->datastore->read_to_fileRecord).
                 super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4);
  pLVar1 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->mappings).
                super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                super__Vector_impl_data._M_start; __args != pLVar1; __args = __args + 1) {
    lVar2 = (long)__args->nEnd - (long)__args->nStart;
    if ((size <= lVar2) && (id <= ((float)__args->score * 100.0) / (float)(int)lVar2)) {
      std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
      emplace_back<LongReadMapping_const&>
                ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + __args->read_id),__args);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<LongReadMapping>> LongReadsMapper::filter_mappings_by_size_and_id(int64_t size, float id) const {
    std::vector<std::vector<LongReadMapping>> filtered_read_mappings;
    filtered_read_mappings.resize(datastore.size()+1);
    for (auto &m:mappings){
        if (m.nEnd-m.nStart>=size and 100.0*m.score/(m.nEnd-m.nStart)>=id){
            filtered_read_mappings[m.read_id].emplace_back(m);
        }
    }
    return filtered_read_mappings;
}